

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O0

Compressed_lower_distance_matrix *
read_distance_matrix(Compressed_lower_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  bool bVar1;
  istream *piVar2;
  long *plVar3;
  bool local_20a;
  int local_1ec;
  istringstream local_1e8 [4];
  int j;
  istringstream s;
  int local_58;
  float local_54;
  int i;
  value_t value;
  string line;
  vector<float,_std::allocator<float>_> distances;
  istream *input_stream_local;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)((long)&line.field_2 + 8));
  std::__cxx11::string::string((string *)&i);
  local_58 = 0;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input_stream,(string *)&i);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::istringstream::istringstream(local_1e8,&i,8);
    local_1ec = 0;
    while( true ) {
      local_20a = false;
      if (local_1ec < local_58) {
        plVar3 = (long *)std::istream::operator>>(local_1e8,&local_54);
        local_20a = std::ios::operator_cast_to_bool
                              ((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
      }
      if (local_20a == false) break;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)((long)&line.field_2 + 8),&local_54);
      std::istream::ignore();
      local_1ec = local_1ec + 1;
    }
    std::__cxx11::istringstream::~istringstream(local_1e8);
    local_58 = local_58 + 1;
  }
  Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
  Compressed_distance_matrix
            (__return_storage_ptr__,
             (vector<float,_std::allocator<float>_> *)((long)&line.field_2 + 8));
  std::__cxx11::string::~string((string *)&i);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)((long)&line.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

Compressed_lower_distance_matrix read_distance_matrix(std::istream& input_stream) {
  std::vector<value_t> distances;

  std::string line;
  value_t value;
  for (int i = 0; std::getline(input_stream, line); ++i) {
    std::istringstream s(line);
    for (int j = 0; j < i && s >> value; ++j) {
      distances.push_back(value);
      s.ignore();
    }
  }

  return Compressed_lower_distance_matrix(std::move(distances));
}